

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testobject.cpp
# Opt level: O1

int talking_gvrtop_proc(Am_Object *self)

{
  int iVar1;
  Am_Value *this;
  ostream *poVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"In Right formula.",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  this = (Am_Value *)Am_Object::Get((ushort)self,0x2724);
  iVar1 = Am_Value::operator_cast_to_int(this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Right Returns ",0xe);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return iVar1;
}

Assistant:

Am_Define_Formula(int, talking_gvrtop)
{
  cout << "In Right formula." << endl;
  int top = self.Get(TOP);
  cout << "Right Returns " << top << "." << endl;
  return top;
}